

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFilteringTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::Texture2DArrayFilteringCase::init
          (Texture2DArrayFilteringCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
  *this_00;
  uint height;
  pointer pPVar1;
  uint uVar2;
  int iVar3;
  int extraout_EAX;
  Texture2DArray *pTVar4;
  ulong uVar5;
  ulong uVar6;
  RenderTarget *pRVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  RGBA local_198;
  RGBA local_194;
  PixelBufferAccess levelBuf;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  PixelBufferAccess local_148;
  Vec4 gMax;
  Vec4 gMin;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  Vector<float,_4> res_3;
  int local_c8 [18];
  TextureFormat texFmt;
  TextureFormatInfo fmtInfo;
  
  texFmt = glu::mapGLInternalFormat(this->m_internalFormat);
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  uVar11 = this->m_width;
  height = this->m_height;
  uVar2 = height;
  if ((int)height < (int)uVar11) {
    uVar2 = uVar11;
  }
  uVar15 = 0x20;
  if (uVar2 != 0) {
    uVar15 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar15 == 0; uVar15 = uVar15 - 1) {
      }
    }
    uVar15 = uVar15 ^ 0x1f;
  }
  pTVar4 = (Texture2DArray *)operator_new(0x70);
  glu::Texture2DArray::Texture2DArray
            (pTVar4,((this->super_TestCase).m_context)->m_renderCtx,this->m_internalFormat,uVar11,
             height,this->m_numLayers);
  this->m_gradientTex = pTVar4;
  pTVar4 = (Texture2DArray *)operator_new(0x70);
  glu::Texture2DArray::Texture2DArray
            (pTVar4,((this->super_TestCase).m_context)->m_renderCtx,this->m_internalFormat,
             this->m_width,this->m_height,this->m_numLayers);
  this->m_gridTex = pTVar4;
  local_c8[0] = 0;
  local_c8[1] = 1;
  local_c8[2] = 2;
  local_c8[3] = 3;
  local_c8[4] = 2;
  local_c8[5] = 1;
  local_c8[6] = 3;
  local_c8[7] = 0;
  local_c8[8] = 3;
  local_c8[9] = 0;
  local_c8[10] = 1;
  local_c8[0xb] = 2;
  local_c8[0xc] = 1;
  local_c8[0xd] = 3;
  local_c8[0xe] = 2;
  local_c8[0xf] = 0;
  if (uVar2 != 0) {
    local_168 = fmtInfo.valueMax.m_data[0];
    fStack_164 = fmtInfo.valueMax.m_data[1];
    fStack_160 = fmtInfo.valueMax.m_data[2];
    fStack_15c = fmtInfo.valueMax.m_data[3];
    local_158 = fmtInfo.valueMin.m_data[0];
    fStack_154 = fmtInfo.valueMin.m_data[1];
    fStack_150 = fmtInfo.valueMin.m_data[2];
    fStack_14c = fmtInfo.valueMin.m_data[3];
    local_168 = local_168 - local_158;
    fStack_164 = fStack_164 - fStack_154;
    fStack_160 = fStack_160 - fStack_150;
    fStack_15c = fStack_15c - fStack_14c;
    iVar3 = 0x1f - uVar15;
    lVar13 = 0;
    iVar8 = 0;
    if (0 < iVar3) {
      iVar8 = iVar3;
    }
    uVar6 = 0;
    do {
      tcu::Texture2DArray::allocLevel(&this->m_gradientTex->m_refTexture,(int)uVar6);
      pPVar1 = (this->m_gradientTex->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      levelBuf.super_ConstPixelBufferAccess.m_format = *(TextureFormat *)(pPVar1 + uVar6);
      lVar9 = 2;
      do {
        levelBuf.super_ConstPixelBufferAccess.m_size.m_data[lVar9 + -2] =
             *(int *)((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar9 * 4 + lVar13 + -8);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 5);
      lVar9 = 5;
      do {
        levelBuf.super_ConstPixelBufferAccess.m_size.m_data[lVar9 + -2] =
             *(int *)((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar9 * 4 + lVar13 + -8);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 8);
      levelBuf.super_ConstPixelBufferAccess.m_data =
           *(void **)((TextureFormat *)(pPVar1 + uVar6) + 4);
      if (0 < this->m_numLayers) {
        uVar11 = 0;
        iVar12 = 0;
        do {
          uVar5 = (ulong)(uVar11 & 0x30);
          lVar10 = (long)*(int *)((long)local_c8 + uVar5 + 4);
          lVar14 = (long)*(int *)((long)local_c8 + uVar5 + 8);
          lVar9 = (long)*(int *)((long)local_c8 + uVar5 + 0xc);
          local_148.super_ConstPixelBufferAccess.m_format.order = R;
          local_148.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
          local_148.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
          local_148.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f800000;
          gMin.m_data[0] =
               (float)local_148.super_ConstPixelBufferAccess.m_size.m_data
                      [(long)*(int *)((long)local_c8 + uVar5) + -2] * local_168 + local_158;
          gMin.m_data[1] =
               (float)local_148.super_ConstPixelBufferAccess.m_size.m_data[lVar10 + -2] * fStack_164
               + fStack_154;
          gMin.m_data[2] =
               (float)local_148.super_ConstPixelBufferAccess.m_size.m_data[lVar14 + -2] * fStack_160
               + fStack_150;
          gMin.m_data[3] =
               (float)local_148.super_ConstPixelBufferAccess.m_size.m_data[lVar9 + -2] * fStack_15c
               + fStack_14c;
          local_148.super_ConstPixelBufferAccess.m_format.order = 0x3f800000;
          local_148.super_ConstPixelBufferAccess.m_format.type = 0x3f800000;
          local_148.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3f800000;
          local_148.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
          gMax.m_data[0] =
               (float)local_148.super_ConstPixelBufferAccess.m_size.m_data
                      [(long)*(int *)((long)local_c8 + uVar5) + -2] * local_168 + local_158;
          gMax.m_data[1] =
               (float)local_148.super_ConstPixelBufferAccess.m_size.m_data[lVar10 + -2] * fStack_164
               + fStack_154;
          gMax.m_data[2] =
               (float)local_148.super_ConstPixelBufferAccess.m_size.m_data[lVar14 + -2] * fStack_160
               + fStack_150;
          gMax.m_data[3] =
               (float)local_148.super_ConstPixelBufferAccess.m_size.m_data[lVar9 + -2] * fStack_15c
               + fStack_14c;
          tcu::getSubregion(&local_148,&levelBuf,0,0,iVar12,
                            levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0],
                            levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1],1);
          tcu::fillWithComponentGradients(&local_148,&gMin,&gMax);
          iVar12 = iVar12 + 1;
          uVar11 = uVar11 + 0x10;
        } while (iVar12 < this->m_numLayers);
      }
      uVar6 = uVar6 + 1;
      lVar13 = lVar13 + 0x28;
    } while (uVar6 != iVar8 + 1);
    if (uVar2 != 0) {
      lVar13 = 0;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      uVar6 = 0;
      do {
        tcu::Texture2DArray::allocLevel(&this->m_gridTex->m_refTexture,(int)uVar6);
        pPVar1 = (this->m_gridTex->m_refTexture).super_TextureLevelPyramid.m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        levelBuf.super_ConstPixelBufferAccess.m_format = *(TextureFormat *)(pPVar1 + uVar6);
        lVar9 = 2;
        do {
          levelBuf.super_ConstPixelBufferAccess.m_size.m_data[lVar9 + -2] =
               *(int *)((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data +
                       lVar9 * 4 + lVar13 + -8);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 5);
        lVar9 = 5;
        do {
          levelBuf.super_ConstPixelBufferAccess.m_size.m_data[lVar9 + -2] =
               *(int *)((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data +
                       lVar9 * 4 + lVar13 + -8);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 8);
        levelBuf.super_ConstPixelBufferAccess.m_data =
             *(void **)((TextureFormat *)(pPVar1 + uVar6) + 4);
        iVar8 = this->m_numLayers;
        if (0 < iVar8) {
          iVar12 = 0;
          uVar5 = uVar6 & 0xffffffff;
          do {
            tcu::getSubregion(&local_148,&levelBuf,0,0,iVar12,
                              levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0],
                              levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1],1);
            uVar11 = (int)(0xffffff / (long)(int)(iVar8 * (0x20 - uVar15) + -1)) * (int)uVar5;
            local_194.m_value = uVar11 | 0xff000000;
            tcu::RGBA::toVec(&local_194);
            local_198.m_value = ~uVar11 | 0xff000000;
            gMin.m_data[0] = gMax.m_data[0] * local_168 + local_158;
            gMin.m_data[1] = gMax.m_data[1] * fStack_164 + fStack_154;
            gMin.m_data[2] = gMax.m_data[2] * fStack_160 + fStack_150;
            gMin.m_data[3] = gMax.m_data[3] * fStack_15c + fStack_14c;
            tcu::RGBA::toVec(&local_198);
            res_3.m_data[0] = local_e8 * local_168 + local_158;
            res_3.m_data[1] = fStack_e4 * fStack_164 + fStack_154;
            res_3.m_data[2] = fStack_e0 * fStack_160 + fStack_150;
            res_3.m_data[3] = fStack_dc * fStack_15c + fStack_14c;
            tcu::fillWithGrid(&local_148,4,&gMin,&res_3);
            iVar12 = iVar12 + 1;
            iVar8 = this->m_numLayers;
            uVar5 = (ulong)((int)uVar5 + (0x20 - uVar15));
          } while (iVar12 < iVar8);
        }
        uVar6 = uVar6 + 1;
        lVar13 = lVar13 + 0x28;
      } while (uVar6 != iVar3 + 1);
    }
  }
  glu::Texture2DArray::upload(this->m_gradientTex);
  glu::Texture2DArray::upload(this->m_gridTex);
  this_00 = &this->m_cases;
  levelBuf.super_ConstPixelBufferAccess.m_format = (TextureFormat)this->m_gradientTex;
  levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3fc00000;
  levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x40333333;
  levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = -0x40800000;
  levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = -0x3fd33333;
  levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = (int)((float)this->m_numLayers + 0.5);
  levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[1] = -0x41000000;
  std::
  vector<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>
            (this_00,(FilterCase *)&levelBuf);
  levelBuf.super_ConstPixelBufferAccess.m_format = (TextureFormat)this->m_gridTex;
  levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3e4ccccd;
  levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3e333333;
  levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = -0x40000000;
  levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = -0x3f933333;
  levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = (int)((float)this->m_numLayers + 0.5);
  levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[1] = -0x41000000;
  std::
  vector<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>
            (this_00,(FilterCase *)&levelBuf);
  levelBuf.super_ConstPixelBufferAccess.m_format = (TextureFormat)this->m_gridTex;
  levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x40b33333;
  levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = -0x3feccccd;
  levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3e4ccccd;
  levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = -0x42333333;
  levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = -0x41000000;
  levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[1] = (int)((float)this->m_numLayers + 0.5);
  std::
  vector<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>
            (this_00,(FilterCase *)&levelBuf);
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (pRVar7->m_numSamples == 0) {
    levelBuf.super_ConstPixelBufferAccess.m_format = (TextureFormat)this->m_gradientTex;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x40000000;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = -0x40400000;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = -0x42333333;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x3f666666;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0x3fc00054;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0x3fbfffac;
    std::
    vector<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>
              (this_00,(FilterCase *)&levelBuf);
  }
  this->m_caseNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void Texture2DArrayFilteringCase::init (void)
{
	try
	{
		const tcu::TextureFormat		texFmt		= glu::mapGLInternalFormat(m_internalFormat);
		const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
		const tcu::Vec4					cScale		= fmtInfo.valueMax-fmtInfo.valueMin;
		const tcu::Vec4					cBias		= fmtInfo.valueMin;
		const int						numLevels	= deLog2Floor32(de::max(m_width, m_height)) + 1;

		// Create textures.
		m_gradientTex	= new glu::Texture2DArray(m_context.getRenderContext(), m_internalFormat, m_width, m_height, m_numLayers);
		m_gridTex		= new glu::Texture2DArray(m_context.getRenderContext(), m_internalFormat, m_width, m_height, m_numLayers);

		const tcu::IVec4 levelSwz[] =
		{
			tcu::IVec4(0,1,2,3),
			tcu::IVec4(2,1,3,0),
			tcu::IVec4(3,0,1,2),
			tcu::IVec4(1,3,2,0),
		};

		// Fill first gradient texture (gradient direction varies between layers).
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			m_gradientTex->getRefTexture().allocLevel(levelNdx);

			const tcu::PixelBufferAccess levelBuf = m_gradientTex->getRefTexture().getLevel(levelNdx);

			for (int layerNdx = 0; layerNdx < m_numLayers; layerNdx++)
			{
				const tcu::IVec4	swz		= levelSwz[layerNdx%DE_LENGTH_OF_ARRAY(levelSwz)];
				const tcu::Vec4		gMin	= tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f).swizzle(swz[0],swz[1],swz[2],swz[3])*cScale + cBias;
				const tcu::Vec4		gMax	= tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f).swizzle(swz[0],swz[1],swz[2],swz[3])*cScale + cBias;

				tcu::fillWithComponentGradients(tcu::getSubregion(levelBuf, 0, 0, layerNdx, levelBuf.getWidth(), levelBuf.getHeight(), 1), gMin, gMax);
			}
		}

		// Fill second with grid texture (each layer has unique colors).
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			m_gridTex->getRefTexture().allocLevel(levelNdx);

			const tcu::PixelBufferAccess levelBuf = m_gridTex->getRefTexture().getLevel(levelNdx);

			for (int layerNdx = 0; layerNdx < m_numLayers; layerNdx++)
			{
				const deUint32	step	= 0x00ffffff / (numLevels*m_numLayers - 1);
				const deUint32	rgb		= step * (levelNdx + layerNdx*numLevels);
				const deUint32	colorA	= 0xff000000 | rgb;
				const deUint32	colorB	= 0xff000000 | ~rgb;

				tcu::fillWithGrid(tcu::getSubregion(levelBuf, 0, 0, layerNdx, levelBuf.getWidth(), levelBuf.getHeight(), 1),
								  4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
			}
		}

		// Upload.
		m_gradientTex->upload();
		m_gridTex->upload();

		// Test cases
		m_cases.push_back(FilterCase(m_gradientTex,	tcu::Vec2( 1.5f,  2.8f  ),	tcu::Vec2(-1.0f, -2.7f), tcu::Vec2(-0.5f, float(m_numLayers)+0.5f)));
		m_cases.push_back(FilterCase(m_gridTex,		tcu::Vec2( 0.2f,  0.175f),	tcu::Vec2(-2.0f, -3.7f), tcu::Vec2(-0.5f, float(m_numLayers)+0.5f)));
		m_cases.push_back(FilterCase(m_gridTex,		tcu::Vec2(-0.8f, -2.3f  ),	tcu::Vec2( 0.2f, -0.1f), tcu::Vec2(float(m_numLayers)+0.5f, -0.5f)));

		// Level rounding - only in single-sample configs as multisample configs may produce smooth transition at the middle.
		if (m_context.getRenderTarget().getNumSamples() == 0)
			m_cases.push_back(FilterCase(m_gradientTex,	tcu::Vec2(-2.0f, -1.5f  ),	tcu::Vec2(-0.1f,  0.9f), tcu::Vec2(1.50001f, 1.49999f)));

		m_caseNdx = 0;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	catch (...)
	{
		// Clean up to save memory.
		Texture2DArrayFilteringCase::deinit();
		throw;
	}
}